

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_3,_3> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,3,3>
          (Matrix<float,_3,_3> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_3> *a,
          Vector<float,_3> *b)

{
  float fVar1;
  undefined1 auVar2 [16];
  Matrix<float,_3,_3> *pMVar3;
  float *pfVar4;
  float *pfVar5;
  int r;
  long lVar6;
  int row;
  long lVar7;
  int c;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar12;
  undefined4 uVar13;
  float afStack_38 [2];
  Matrix<float,_3,_3> retVal;
  long lVar11;
  
  auVar2 = _DAT_00ad8f80;
  pMVar3 = __return_storage_ptr__;
  pfVar4 = afStack_38;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  afStack_38[0] = 0.0;
  afStack_38[1] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  lVar6 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    auVar9 = _DAT_00ada920;
    do {
      bVar12 = SUB164(auVar9 ^ _DAT_00ad8f80,4) == -0x80000000 &&
               SUB164(auVar9 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar6 != lVar8) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pfVar4 + lVar8) = uVar13;
      }
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar6 + -0xc != lVar8) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pfVar4 + lVar8 + 0xc) = uVar13;
      }
      lVar11 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar11 + 2;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x30);
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0xc;
    pfVar4 = pfVar4 + 1;
  } while (lVar7 != 3);
  pfVar4 = afStack_38;
  lVar6 = 0;
  do {
    fVar1 = a->m_data[lVar6];
    lVar7 = 0;
    pfVar5 = pfVar4;
    do {
      *pfVar5 = *(float *)(this + lVar7 * 4) * fVar1;
      lVar7 = lVar7 + 1;
      pfVar5 = pfVar5 + 3;
    } while (lVar7 != 3);
    lVar6 = lVar6 + 1;
    pfVar4 = pfVar4 + 1;
  } while (lVar6 != 3);
  *(undefined1 (*) [16])((__return_storage_ptr__->m_data).m_data[1].m_data + 1) =
       (undefined1  [16])0x0;
  (__return_storage_ptr__->m_data).m_data[0] = (float  [3])0x0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  auVar9 = _DAT_00ada920;
  lVar6 = 0;
  lVar7 = 0;
  pfVar4 = (float *)__return_storage_ptr__;
  do {
    lVar8 = 0;
    auVar10 = auVar9;
    do {
      bVar12 = SUB164(auVar10 ^ auVar2,4) == -0x80000000 && SUB164(auVar10 ^ auVar2,0) < -0x7ffffffd
      ;
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar6 != lVar8) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pfVar4 + lVar8) = uVar13;
      }
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar6 + -0xc != lVar8) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pfVar4 + lVar8 + 0xc) = uVar13;
      }
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x30);
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0xc;
    pfVar4 = pfVar4 + 1;
  } while (lVar7 != 3);
  pfVar4 = afStack_38;
  lVar6 = 0;
  do {
    lVar7 = 0;
    pfVar5 = pfVar4;
    do {
      ((Vector<tcu::Vector<float,_3>,_3> *)((Vector<float,_3> *)__return_storage_ptr__)->m_data)->
      m_data[0].m_data[lVar7] = *pfVar5;
      lVar7 = lVar7 + 1;
      pfVar5 = pfVar5 + 3;
    } while (lVar7 != 3);
    lVar6 = lVar6 + 1;
    __return_storage_ptr__ = (Matrix<float,_3,_3> *)((long)__return_storage_ptr__ + 0xc);
    pfVar4 = pfVar4 + 1;
  } while (lVar6 != 3);
  return pMVar3;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}